

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparsityPatternLearner.h
# Opt level: O3

void __thiscall
chrono::ChSparsityPatternLearner::ChSparsityPatternLearner
          (ChSparsityPatternLearner *this,int nrows,int ncols)

{
  (this->super_SparseMatrix<double,_1,_int>).
  super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue = false;
  (this->super_SparseMatrix<double,_1,_int>)._vptr_SparseMatrix =
       (_func_int **)&PTR_SetElement_00b0c488;
  (this->super_SparseMatrix<double,_1,_int>).m_outerSize = 0;
  (this->super_SparseMatrix<double,_1,_int>).m_innerSize = 0;
  (this->super_SparseMatrix<double,_1,_int>).m_outerIndex = (StorageIndex *)0x0;
  (this->super_SparseMatrix<double,_1,_int>).m_innerNonZeros = (StorageIndex *)0x0;
  (this->super_SparseMatrix<double,_1,_int>).m_data.m_values = (Scalar *)0x0;
  (this->super_SparseMatrix<double,_1,_int>).m_data.m_indices = (StorageIndex *)0x0;
  (this->super_SparseMatrix<double,_1,_int>).m_data.m_size = 0;
  (this->super_SparseMatrix<double,_1,_int>).m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize
            (&this->super_SparseMatrix<double,_1,_int>,(long)nrows,(long)ncols);
  (this->super_SparseMatrix<double,_1,_int>)._vptr_SparseMatrix =
       (_func_int **)&PTR_SetElement_00b39a28;
  (this->innerVectors).
  super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->innerVectors).
  super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->innerVectors).
  super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)
   ((long)&(this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 1) = 0;
  *(undefined8 *)
   ((long)&(this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  std::
  vector<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::resize(&this->innerVectors,(this->super_SparseMatrix<double,_1,_int>).m_outerSize);
  return;
}

Assistant:

ChSparsityPatternLearner(int nrows, int ncols) : ChSparseMatrix(nrows, ncols), processed(false) {
        // RowMajor: outerSize == nrows
        // ColMajor: outerSize == ncols
        innerVectors.resize(outerSize());
    }